

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::CallIExtended
          (ByteCodeWriter *this,OpCode op,RegSlot returnValueRegister,RegSlot functionRegister,
          ArgSlot givenArgCount,CallIExtendedOptions options,void *buffer,uint byteCount,
          ProfileId callSiteId,CallFlags callFlags)

{
  ushort uVar1;
  code *pcVar2;
  CallIExtendedOptions options_00;
  bool bVar3;
  undefined4 *puVar4;
  char *pcVar5;
  uint uVar6;
  FunctionBody *pFVar7;
  undefined7 in_register_00000089;
  RegSlot returnValueRegister_00;
  undefined4 uVar8;
  ArgSlot local_6b;
  RegSlot local_69;
  RegSlot local_65;
  undefined1 local_61;
  uint32 local_60;
  CallFlags local_5c;
  CacheIdUnit local_58;
  CacheIdUnit unit;
  ushort local_44;
  ushort local_42;
  uint local_40;
  ProfileId profileId;
  ProfileId profileId2;
  RegSlot local_38;
  RegSlot functionRegister_local;
  OpCode op_local;
  
  pcVar5 = (char *)(ulong)functionRegister;
  local_40 = (uint)CONCAT71(in_register_00000089,options);
  _profileId = functionRegister;
  functionRegister_local._2_2_ = op;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)((uint)(callFlags != CallFlags_None) * 3 + 0x26));
  bVar3 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    pcVar5 = "OpCodeAttr::HasMultiSizeLayout(op)";
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x42a,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar3) goto LAB_0088fb97;
    *puVar4 = 0;
  }
  if (returnValueRegister == 0xffffffff) {
    local_38 = 0xffffffff;
  }
  else {
    pFVar7 = this->m_functionWrite;
    if (pFVar7 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      pcVar5 = "this->m_functionWrite";
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar3) goto LAB_0088fb97;
      *puVar4 = 0;
      pFVar7 = this->m_functionWrite;
    }
    local_38 = FunctionBody::MapRegSlot(pFVar7,returnValueRegister);
  }
  if (functionRegister == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
    if (bVar3) {
      *puVar4 = 0;
      Throw::InternalError();
    }
    goto LAB_0088fb97;
  }
  pFVar7 = this->m_functionWrite;
  if (pFVar7 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    pcVar5 = "this->m_functionWrite";
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
    if (!bVar3) goto LAB_0088fb97;
    *puVar4 = 0;
    pFVar7 = this->m_functionWrite;
  }
  _profileId = FunctionBody::MapRegSlot(pFVar7,functionRegister);
  local_58.cacheId = 0xffffffff;
  JsUtil::
  BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::TryGetValueAndRemove(this->callRegToLdFldCacheIndexMap,(uint *)&profileId,&local_58);
  local_44 = callSiteId;
  local_42 = 0xffff;
  if ((ushort)(op - CallI) < 4) {
    bVar3 = DoDynamicProfileOpcode(this,InlinePhase,false);
    if ((callSiteId == 0xffff) || (!bVar3)) {
      bVar3 = DynamicProfileInfo::IsEnabled(AggressiveIntTypeSpecPhase,this->m_functionWrite);
      returnValueRegister_00 = local_38;
      if ((bVar3) ||
         (bVar3 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite), bVar3)) {
        uVar1 = this->m_functionWrite->profiledReturnTypeCount;
        pcVar5 = (char *)(ulong)uVar1;
        if (uVar1 != 0xffff) {
          this->m_functionWrite->profiledReturnTypeCount = uVar1 + 1;
          local_44 = uVar1;
          functionRegister_local._2_2_ = OpCodeUtil::ConvertCallOpToProfiledReturnType(op);
          goto LAB_0088f8fd;
        }
      }
LAB_0088f8bd:
      uVar8._0_1_ = false;
      uVar8._1_3_ = 0;
      unit.cacheId = 0;
    }
    else {
      uVar8._0_1_ = false;
      uVar8._1_3_ = 0;
      functionRegister_local._2_2_ = OpCodeUtil::ConvertCallOpToProfiled(op,false);
LAB_0088f888:
      unit.cacheId = (uint)CONCAT71((int7)((ulong)pcVar5 >> 8),1);
      returnValueRegister_00 = local_38;
    }
  }
  else {
    bVar3 = DoProfileNewScObjArrayOp(this,op);
    if (bVar3) {
      bVar3 = DynamicProfileInfo::IsEnabled(NativeArrayPhase,this->m_functionWrite);
      if (bVar3) {
        if (callSiteId != 0xffff) {
LAB_0088f85d:
          uVar1 = this->m_functionWrite->profiledArrayCallSiteCount;
          pcVar5 = (char *)(ulong)uVar1;
          if (uVar1 != 0xffff) {
            this->m_functionWrite->profiledArrayCallSiteCount = uVar1 + 1;
            local_42 = uVar1;
            OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&functionRegister_local + 2));
            uVar8 = (undefined4)CONCAT71((uint7)(uint3)(functionRegister >> 8),1);
            goto LAB_0088f888;
          }
        }
      }
      else {
        bVar3 = DoDynamicProfileOpcode(this,InlinePhase,true);
        if ((callSiteId != 0xffff) && (bVar3)) goto LAB_0088f85d;
      }
    }
    bVar3 = DoProfileNewScObjectOp(this,functionRegister_local._2_2_);
    if (bVar3) {
      bVar3 = DoDynamicProfileOpcode(this,InlinePhase,true);
      if (bVar3) {
        returnValueRegister_00 = local_38;
        if (callSiteId == 0xffff) goto LAB_0088f8bd;
      }
      else {
        bVar3 = DynamicProfileInfo::IsEnabled(FixedNewObjPhase,this->m_functionWrite);
        uVar8._0_1_ = false;
        uVar8._1_3_ = 0;
        if (callSiteId == 0xffff) goto LAB_0088f8c7;
        pcVar5 = (char *)0x0;
        unit.cacheId = 0;
        returnValueRegister_00 = local_38;
        if (!bVar3) goto LAB_0088f902;
      }
      returnValueRegister_00 = local_38;
      OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&functionRegister_local + 2));
LAB_0088f8fd:
      unit.cacheId = (uint)CONCAT71((int7)((ulong)pcVar5 >> 8),1);
      uVar8._0_1_ = false;
      uVar8._1_3_ = 0;
    }
    else {
LAB_0088f8c7:
      uVar8._0_1_ = false;
      uVar8._1_3_ = 0;
      unit.cacheId = 0;
      returnValueRegister_00 = local_38;
    }
  }
LAB_0088f902:
  uVar6 = 0;
  unit._4_4_ = uVar8;
  if ((local_40 & 1) != 0) {
    if (byteCount == 0 || buffer == (void *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x460,"(buffer != nullptr && byteCount > 0)",
                                  "buffer != nullptr && byteCount > 0");
      if (!bVar3) {
LAB_0088fb97:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
      uVar6 = (this->m_auxiliaryData).currentOffset;
      returnValueRegister_00 = local_38;
      if (byteCount == 0) goto LAB_0088f9ae;
    }
    else {
      uVar6 = (this->m_auxiliaryData).currentOffset;
    }
    Data::Encode(&this->m_auxiliaryData,buffer,byteCount);
  }
LAB_0088f9ae:
  options_00 = (CallIExtendedOptions)local_40;
  if (callFlags == CallFlags_None) {
    bVar3 = TryWriteCallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,functionRegister_local._2_2_,returnValueRegister_00,_profileId,
                       givenArgCount,(CallIExtendedOptions)local_40,uVar6);
    if ((bVar3) ||
       (bVar3 = TryWriteCallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                          (this,functionRegister_local._2_2_,returnValueRegister_00,_profileId,
                           givenArgCount,options_00,uVar6), bVar3)) goto LAB_0088fb01;
    local_65 = _profileId;
    local_61 = (undefined1)local_40;
    local_6b = givenArgCount;
    local_69 = returnValueRegister_00;
    local_60 = uVar6;
    Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,functionRegister_local._2_2_,this);
    uVar6 = 0xf;
  }
  else {
    bVar3 = TryWriteCallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,functionRegister_local._2_2_,returnValueRegister_00,_profileId,
                       givenArgCount,(CallIExtendedOptions)local_40,uVar6,callFlags);
    if ((bVar3) ||
       (bVar3 = TryWriteCallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                          (this,functionRegister_local._2_2_,returnValueRegister_00,_profileId,
                           givenArgCount,options_00,uVar6,callFlags), bVar3)) goto LAB_0088fb01;
    local_65 = _profileId;
    local_61 = (undefined1)local_40;
    local_5c = callFlags;
    local_6b = givenArgCount;
    local_69 = returnValueRegister_00;
    local_60 = uVar6;
    Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,functionRegister_local._2_2_,this);
    uVar6 = 0x13;
  }
  Data::Write(&this->m_byteCodeData,&local_6b,uVar6);
LAB_0088fb01:
  if ((char)unit.cacheId != '\0') {
    Data::Write(&this->m_byteCodeData,&local_44,2);
    if (unit.isRootObjectCache != false) {
      Data::Write(&this->m_byteCodeData,&local_42,2);
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::CallIExtended(OpCode op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, CallIExtendedOptions options, const void *buffer, uint byteCount, ProfileId callSiteId, CallFlags callFlags)
    {
        CheckOpen();
        bool hasCallFlags = !(callFlags == CallFlags_None);
        if (hasCallFlags)
        {
            CheckOp(op, OpLayoutType::CallIExtendedFlags);
        }
        else
        {
            CheckOp(op, OpLayoutType::CallIExtended);
        }
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        // givenArgCount could be <, ==, or > than Function's "InParams" count

        if (returnValueRegister != Js::Constants::NoRegister)
        {
            returnValueRegister = ConsumeReg(returnValueRegister);
        }
        functionRegister = ConsumeReg(functionRegister);

        // CallISpread is not going to use the ldFld cache index, but still remove it from the map as we expect
        // the entry for a cache index to be removed once we have seen the corresponding call.
        CacheIdUnit unit;
        unit.cacheId = Js::Constants::NoInlineCacheIndex;
        callRegToLdFldCacheIndexMap->TryGetValueAndRemove(functionRegister, &unit);

        bool isProfiled = false, isProfiled2 = false;
        ProfileId profileId = callSiteId, profileId2 = Constants::NoProfileId;
        bool isCallWithICIndex = false;

        if (DoProfileCallOp(op))
        {
            if (DoDynamicProfileOpcode(InlinePhase) &&
                callSiteId != Js::Constants::NoProfileId)
            {
                op = Js::OpCodeUtil::ConvertCallOpToProfiled(op);
                isProfiled = true;
            }
            else if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) || DoDynamicProfileOpcode(FloatTypeSpecPhase)) &&
                this->m_functionWrite->AllocProfiledReturnTypeId(&profileId))
            {
                op = Js::OpCodeUtil::ConvertCallOpToProfiledReturnType(op);
                isProfiled = true;
            }
        }
        else if (DoProfileNewScObjArrayOp(op) &&
            (DoDynamicProfileOpcode(NativeArrayPhase, true) || DoDynamicProfileOpcode(InlinePhase, true)) &&
            callSiteId != Js::Constants::NoProfileId &&
            this->m_functionWrite->AllocProfiledArrayCallSiteId(&profileId2))
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
            isProfiled = true;
            isProfiled2 = true;
        }
        else if (DoProfileNewScObjectOp(op) && (DoDynamicProfileOpcode(InlinePhase, true) || DoDynamicProfileOpcode(FixedNewObjPhase, true)) &&
            callSiteId != Js::Constants::NoProfileId)
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
            isProfiled = true;
        }

        uint spreadArgsOffset = 0;
        if (options & CallIExtended_SpreadArgs)
        {
            Assert(buffer != nullptr && byteCount > 0);
            spreadArgsOffset = InsertAuxiliaryData(buffer, byteCount);
        }

        if (isCallWithICIndex)
        {
            if (hasCallFlags == true)
            {
                MULTISIZE_LAYOUT_WRITE(CallIExtendedFlagsWithICIndex, op, returnValueRegister, functionRegister, givenArgCount, unit.cacheId, unit.isRootObjectCache, options, spreadArgsOffset, callFlags);
            }
            else
            {
                MULTISIZE_LAYOUT_WRITE(CallIExtendedWithICIndex, op, returnValueRegister, functionRegister, givenArgCount, unit.cacheId, unit.isRootObjectCache, options, spreadArgsOffset);
            }
        }
        else
        {
            if (hasCallFlags == true)
            {
                MULTISIZE_LAYOUT_WRITE(CallIExtendedFlags, op, returnValueRegister, functionRegister, givenArgCount, options, spreadArgsOffset, callFlags);
            }
            else
            {
                MULTISIZE_LAYOUT_WRITE(CallIExtended, op, returnValueRegister, functionRegister, givenArgCount, options, spreadArgsOffset);
            }
        }

        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
            if (isProfiled2)
            {
                m_byteCodeData.Encode(&profileId2, sizeof(Js::ProfileId));
            }
        }
    }